

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_thread.cpp
# Opt level: O3

void __thiscall tst_thread::resolve_void(tst_thread *this)

{
  QSharedData *pQVar1;
  PromiseResolver<void> PVar2;
  QThread *pQVar3;
  bool bVar4;
  char cVar5;
  PromiseDataBase<void,_void_()> *pPVar6;
  RunFunctionTaskBase<void> *this_00;
  PromiseDataBase<void,_void_()> *this_01;
  QObject *pQVar7;
  char *pcVar8;
  char *pcVar9;
  QPromiseReject<void> *in_R8;
  QSharedData *pQVar10;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_f0;
  Data *local_e8;
  PromiseResolver<void> resolver_1;
  PromiseResolver<void> resolver;
  undefined1 local_c8 [8];
  undefined8 uStack_c0;
  QThread **local_b8;
  int *piStack_b0;
  int value;
  PromiseDataBase<void,_void_()> *local_a0;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  QSharedData *local_68;
  QThread *source;
  QThread *target;
  function<void_(const_QtPromisePrivate::PromiseError_&)> local_50;
  
  value = -1;
  target = (QThread *)0x0;
  source = (QThread *)0x0;
  pPVar6 = (PromiseDataBase<void,_void_()> *)operator_new(0x58);
  pPVar6->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&pPVar6->super_QSharedData = 0;
  *(undefined8 *)&pPVar6->m_lock = 0;
  *(undefined8 *)&pPVar6->m_settled = 0;
  (pPVar6->m_handlers).d.d = (Data *)0x0;
  (pPVar6->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (pPVar6->m_handlers).d.size = 0;
  (pPVar6->m_catchers).d.d = (Data *)0x0;
  (pPVar6->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar6->m_catchers).d.size = 0;
  (pPVar6->m_error).m_data._M_exception_object = (void *)0x0;
  pPVar6->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_0011bae0;
  QReadWriteLock::QReadWriteLock(&pPVar6->m_lock,0);
  pPVar6->m_settled = false;
  (pPVar6->m_handlers).d.d = (Data *)0x0;
  (pPVar6->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (pPVar6->m_handlers).d.size = 0;
  (pPVar6->m_catchers).d.d = (Data *)0x0;
  (pPVar6->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar6->m_catchers).d.size = 0;
  (pPVar6->m_error).m_data._M_exception_object = (void *)0x0;
  pPVar6->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_0011ba68;
  LOCK();
  (pPVar6->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pPVar6->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  LOCK();
  (pPVar6->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pPVar6->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_68 = &pPVar6->super_QSharedData;
  local_50.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_0011ba30;
  local_a0 = pPVar6;
  local_50.super__Function_base._M_functor._8_8_ = pPVar6;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver,(QPromise<void> *)&local_50);
  local_50.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_0011b918;
  if ((PromiseDataBase<void,_void_()> *)local_50.super__Function_base._M_functor._8_8_ !=
      (PromiseDataBase<void,_void_()> *)0x0) {
    LOCK();
    pQVar10 = (QSharedData *)(local_50.super__Function_base._M_functor._8_8_ + 8);
    (pQVar10->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar10->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar10->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseDataBase<void,_void_()> *)local_50.super__Function_base._M_functor._8_8_ !=
        (PromiseDataBase<void,_void_()> *)0x0)) {
      (**(code **)(*(long *)local_50.super__Function_base._M_functor._8_8_ + 8))();
    }
  }
  PVar2.m_d.d = resolver.m_d.d;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  local_c8 = (undefined1  [8])QThreadPool::globalInstance();
  if (PVar2.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar2.m_d.d = *(int *)PVar2.m_d.d + 1;
    UNLOCK();
  }
  uStack_c0 = (Data *)((ulong)uStack_c0._4_4_ << 0x20);
  this_00 = (RunFunctionTaskBase<void> *)operator_new(0x30);
  this_00->field_0x8 = 1;
  *(undefined ***)this_00 = &PTR_run_0011b9c8;
  QFutureInterfaceBase::QFutureInterfaceBase(&(this_00->promise).super_QFutureInterfaceBase,NoState)
  ;
  *(undefined ***)&this_00->promise = &PTR__QFutureInterfaceBase_0011b9f8;
  *(undefined ***)this_00 = &PTR_run_0011b868;
  *(QThread ***)(this_00 + 1) = &source;
  *(QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
   &this_00[1].field_0x8 = PVar2.m_d.d;
  if (PVar2.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar2.m_d.d = *(int *)PVar2.m_d.d + 1;
    UNLOCK();
  }
  QtConcurrent::RunFunctionTaskBase<void>::start
            ((QFuture<void> *)&local_98,this_00,(TaskStartParameters *)local_c8);
  if (PVar2.m_d.d == (Data *)0x0) {
    QFutureInterfaceBase::~QFutureInterfaceBase((QFutureInterfaceBase *)local_98._M_pod_data);
  }
  else {
    LOCK();
    *(int *)PVar2.m_d.d = *(int *)PVar2.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar2.m_d.d == 0) {
      operator_delete((void *)PVar2.m_d.d,0x10);
    }
    QFutureInterfaceBase::~QFutureInterfaceBase((QFutureInterfaceBase *)local_98._M_pod_data);
    LOCK();
    *(int *)PVar2.m_d.d = *(int *)PVar2.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar2.m_d.d == 0) {
      operator_delete((void *)PVar2.m_d.d,0x10);
    }
    LOCK();
    *(int *)PVar2.m_d.d = *(int *)PVar2.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar2.m_d.d == 0) {
      operator_delete((void *)PVar2.m_d.d,0x10);
    }
  }
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver.m_d.d == 0) {
      operator_delete((void *)resolver.m_d.d,0x10);
    }
  }
  this_01 = (PromiseDataBase<void,_void_()> *)operator_new(0x58);
  this_01->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this_01->super_QSharedData = 0;
  (this_01->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_01->m_catchers).d.size = 0;
  (this_01->m_handlers).d.size = 0;
  (this_01->m_catchers).d.d = (Data *)0x0;
  (this_01->m_handlers).d.d = (Data *)0x0;
  (this_01->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&this_01->m_lock = 0;
  *(undefined8 *)&this_01->m_settled = 0;
  (this_01->m_error).m_data._M_exception_object = (void *)0x0;
  this_01->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_0011bae0;
  QReadWriteLock::QReadWriteLock(&this_01->m_lock,0);
  this_01->m_settled = false;
  (this_01->m_handlers).d.d = (Data *)0x0;
  (this_01->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (this_01->m_handlers).d.size = 0;
  (this_01->m_catchers).d.d = (Data *)0x0;
  (this_01->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_01->m_catchers).d.size = 0;
  (this_01->m_error).m_data._M_exception_object = (void *)0x0;
  this_01->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_0011ba68;
  LOCK();
  (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  pQVar10 = &this_01->super_QSharedData;
  LOCK();
  (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
       &PTR__QPromiseBase_0011ba30;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver_1,(QPromise<void> *)&resolver);
  pPVar6 = local_a0;
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
       &PTR__QPromiseBase_0011b918;
  if (this_01 != (PromiseDataBase<void,_void_()> *)0x0) {
    LOCK();
    pQVar1 = &this_01->super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) && (this_01 != (PromiseDataBase<void,_void_()> *)0x0))
    {
      (*this_01->_vptr_PromiseDataBase[1])();
    }
  }
  if (resolver_1.m_d.d == (Data *)0x0) {
    local_c8 = (undefined1  [8])0x0;
    uStack_c0 = (Data *)0x0;
    goto LAB_001064fd;
  }
  LOCK();
  *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
  UNLOCK();
  if (resolver_1.m_d.d == (Data *)0x0) {
    local_f0.d = (Data *)0x0;
LAB_001064e8:
    local_c8 = (undefined1  [8])resolver_1.m_d.d;
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
    uStack_c0 = local_f0.d;
    if (local_f0.d == (Data *)0x0) goto LAB_001064fd;
  }
  else {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
    local_f0 = resolver_1.m_d.d;
    if (resolver_1.m_d.d != (Data *)0x0) goto LAB_001064e8;
  }
  local_c8 = (undefined1  [8])resolver_1.m_d.d;
  LOCK();
  ((local_f0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
  _q_value.super___atomic_base<int>._M_i =
       ((local_f0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
       super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  uStack_c0 = local_f0.d;
LAB_001064fd:
  local_b8 = &target;
  piStack_b0 = &value;
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  local_88 = (code *)0x0;
  pcStack_80 = (code *)0x0;
  local_f0.d = uStack_c0;
  local_e8 = (Data *)local_c8;
  local_98._M_unused._M_object = operator_new(0x20);
  *(undefined1 (*) [8])local_98._M_unused._0_8_ = local_c8;
  if (local_c8 != (undefined1  [8])0x0) {
    LOCK();
    (((QSharedData *)local_c8)->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)local_c8)->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
         _q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(Data **)((long)local_98._M_unused._0_8_ + 8) = uStack_c0;
  if (uStack_c0 == (Data *)0x0) {
    *(QThread ***)((long)local_98._M_unused._0_8_ + 0x10) = local_b8;
    *(int **)((long)local_98._M_unused._0_8_ + 0x18) = piStack_b0;
    pcStack_80 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
                 ::_M_invoke;
    local_88 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
               ::_M_manager;
  }
  else {
    LOCK();
    (uStack_c0->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         (uStack_c0->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
         ._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    *(QThread ***)((long)local_98._M_unused._0_8_ + 0x10) = local_b8;
    *(int **)((long)local_98._M_unused._0_8_ + 0x18) = piStack_b0;
    pcStack_80 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
                 ::_M_invoke;
    local_88 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
               ::_M_manager;
    if (uStack_c0 != (Data *)0x0) {
      LOCK();
      (uStack_c0->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i =
           (uStack_c0->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((uStack_c0->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
        operator_delete(uStack_c0,0x10);
      }
    }
  }
  if (local_c8 != (undefined1  [8])0x0) {
    LOCK();
    (((QSharedData *)local_c8)->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)local_c8)->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
         _q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QSharedData *)local_c8)->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete((void *)local_c8,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addHandler
            (pPVar6,(function<void_()> *)&local_98);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  QtPromisePrivate::PromiseCatcher<void,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>
            (&local_50,(PromiseCatcher<void,decltype(nullptr),void> *)0x0,&local_e8,
             (QPromiseResolve<void> *)&local_f0,in_R8);
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addCatcher(pPVar6,&local_50);
  if (local_50.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_50.super__Function_base._M_manager)
              ((_Any_data *)&local_50,(_Any_data *)&local_50,__destroy_functor);
  }
  if (local_f0.d != (Data *)0x0) {
    LOCK();
    ((local_f0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          ((local_f0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if ((__int_type)
        ((local_f0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 0) {
      operator_delete(local_f0.d,0x10);
    }
  }
  if (local_e8 != (Data *)0x0) {
    LOCK();
    (local_e8->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         (local_e8->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
         _q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_e8->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_e8,0x10);
    }
  }
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver_1.m_d.d == 0) {
      operator_delete((void *)resolver_1.m_d.d,0x10);
    }
  }
  bVar4 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(pPVar6);
  if (!bVar4) {
    QtPromisePrivate::PromiseDataBase<void,_void_()>::dispatch(pPVar6);
  }
  bVar4 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(this_01);
  while (bVar4 != false) {
    QCoreApplication::processEvents();
    QCoreApplication::sendPostedEvents((QObject *)0x0,0x34);
    bVar4 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(this_01);
  }
  LOCK();
  (pQVar10->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar10->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  LOCK();
  (pQVar10->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar10->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar10->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*this_01->_vptr_PromiseDataBase[1])(this_01);
  }
  LOCK();
  (pQVar10->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar10->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar10->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*this_01->_vptr_PromiseDataBase[1])(this_01);
  }
  LOCK();
  (local_68->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (local_68->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((local_68->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*pPVar6->_vptr_PromiseDataBase[1])(pPVar6);
  }
  cVar5 = QTest::qVerify(source != (QThread *)0x0,"source != nullptr","",
                         "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/thread/tst_thread.cpp"
                         ,0x48);
  if ((cVar5 != '\0') &&
     (cVar5 = QTest::qVerify(source != target,"source != target","",
                             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/thread/tst_thread.cpp"
                             ,0x49), pQVar3 = target, cVar5 != '\0')) {
    pQVar7 = (QObject *)QThread::currentThread();
    pcVar8 = (char *)QTest::toString((QObject *)pQVar3);
    pcVar9 = (char *)QTest::toString(pQVar7);
    cVar5 = QTest::compare_helper
                      (pQVar3 == (QThread *)pQVar7,"Compared QObject pointers are not the same",
                       pcVar8,pcVar9,"target","QThread::currentThread()",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/thread/tst_thread.cpp"
                       ,0x4a);
    if (cVar5 != '\0') {
      QTest::qCompare(value,0x2b,"value","43",
                      "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/thread/tst_thread.cpp"
                      ,0x4b);
    }
  }
  return;
}

Assistant:

void tst_thread::resolve_void()
{
    int value = -1;
    QThread* target = nullptr;
    QThread* source = nullptr;

    QtPromise::QPromise<void>{[&](const QtPromise::QPromiseResolve<void>& resolve) {
        std::ignore = QtConcurrent::run([=, &source]() {
            source = QThread::currentThread();
            resolve();
        });
    }}
        .then([&]() {
            target = QThread::currentThread();
            value = 43;
        })
        .wait();

    QVERIFY(source != nullptr);
    QVERIFY(source != target);
    QCOMPARE(target, QThread::currentThread());
    QCOMPARE(value, 43);
}